

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool opening_token(Env *env,uint32_t i)

{
  _Bool _Var1;
  int32_t iVar2;
  int32_t c;
  uint32_t i_local;
  Env *env_local;
  
  iVar2 = peek(env,i);
  if (((iVar2 != 0x22) && (iVar2 != 0x28)) && (iVar2 != 0x5b)) {
    if (iVar2 == 0x7b) {
      iVar2 = peek(env,i + 1);
      return iVar2 != 0x2d;
    }
    if ((iVar2 != 0x27e6) && (iVar2 != 0x2987)) {
      _Var1 = is_id_char(iVar2);
      return _Var1;
    }
  }
  return true;
}

Assistant:

static bool opening_token(Env *env, uint32_t i) {
  int32_t c = peek(env, i);
  switch (c) {
    case 0x27e6: // ⟦
    case 0x2987: // ⦇
    case '(':
    case '[':
    case '"':
      return true;
    case '{':
      return peek(env, i + 1) != '-';
    default:
      // Includes single quote
      return is_id_char(c);
  }
}